

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  ushort *puVar7;
  byte bVar8;
  long in_RDI;
  wchar_t bitptn [17];
  uchar *bitlen;
  uint16_t *tbl;
  ushort *local_108;
  int local_100;
  ushort local_fa;
  int local_f8;
  undefined2 *local_e8;
  int local_d0;
  int local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int aiStack_b8 [14];
  htree_t *ht;
  wchar_t extlen;
  uint16_t bit;
  wchar_t cnt;
  wchar_t len;
  uint16_t *p_1;
  uint16_t *p;
  wchar_t htbl_max;
  wchar_t ebits;
  wchar_t len_avail;
  wchar_t diffbits;
  wchar_t w;
  wchar_t tbl_size;
  wchar_t ptn;
  wchar_t maxbits;
  wchar_t i;
  long local_20;
  long local_18;
  long local_10;
  wchar_t local_4;
  
  local_c0 = 0;
  local_c4 = 0;
  local_cc = 0x8000;
  for (local_bc = 1; local_bc < 0x11; local_bc = local_bc + 1) {
    *(int *)((long)&p_1 + (long)local_bc * 4) = local_c4;
    aiStack_b8[local_bc] = local_cc;
    if (*(int *)(in_RDI + 0xc + (long)local_bc * 4) != 0) {
      local_c4 = *(int *)(in_RDI + 0xc + (long)local_bc * 4) * local_cc + local_c4;
      local_c0 = local_bc;
    }
    local_cc = local_cc >> 1;
  }
  if ((local_c4 == 0x10000) && (local_c0 <= *(int *)(in_RDI + 0x60))) {
    *(int *)(in_RDI + 0x58) = local_c0;
    local_10 = in_RDI;
    if (local_c0 < 0x10) {
      bVar8 = 0x10 - (char)local_c0;
      for (local_bc = 1; local_bc <= local_c0; local_bc = local_bc + 1) {
        *(int *)((long)&p_1 + (long)local_bc * 4) =
             *(int *)((long)&p_1 + (long)local_bc * 4) >> (bVar8 & 0x1f);
        aiStack_b8[local_bc] = aiStack_b8[local_bc] >> (bVar8 & 0x1f);
      }
    }
    if (local_c0 < 0xb) {
      local_d0 = 0;
    }
    else {
      local_d0 = local_c0 + -10;
      for (local_bc = 1; local_bc < 0xb; local_bc = local_bc + 1) {
        *(int *)((long)&p_1 + (long)local_bc * 4) =
             *(int *)((long)&p_1 + (long)local_bc * 4) >> ((byte)local_d0 & 0x1f);
        aiStack_b8[local_bc] = aiStack_b8[local_bc] >> ((byte)local_d0 & 0x1f);
      }
      local_e8 = (undefined2 *)
                 (*(long *)(local_10 + 0x70) +
                 (long)(tbl_size + aiStack_b8[10] * *(int *)(local_10 + 0x34)) * 2);
      while (local_e8 < (undefined2 *)(*(long *)(local_10 + 0x70) + 0x800)) {
        *local_e8 = 0;
        local_e8 = local_e8 + 1;
      }
    }
    *(int *)(local_10 + 0x5c) = local_d0;
    local_18 = *(long *)(local_10 + 0x70);
    local_20 = *(long *)(local_10 + 0x50);
    iVar1 = *(int *)(local_10 + 4);
    *(undefined4 *)(local_10 + 100) = 0;
    for (local_bc = 0; local_bc < iVar1; local_bc = local_bc + 1) {
      if (*(char *)(local_20 + local_bc) != '\0') {
        uVar6 = (uint)*(byte *)(local_20 + local_bc);
        uVar2 = *(uint *)((long)&p_1 + (long)(int)uVar6 * 4);
        local_f8 = aiStack_b8[(int)uVar6];
        uVar5 = (ushort)local_bc;
        if (uVar6 < 0xb) {
          *(uint *)((long)&p_1 + (long)(int)uVar6 * 4) = uVar2 + local_f8;
          if (0x400 < (int)(uVar2 + local_f8)) {
            return L'\0';
          }
          while (local_f8 = local_f8 + -1, -1 < local_f8) {
            *(ushort *)(local_18 + (long)(int)uVar2 * 2 + (long)local_f8 * 2) = uVar5;
          }
        }
        else {
          *(uint *)((long)&p_1 + (long)(int)uVar6 * 4) = uVar2 + local_f8;
          local_fa = (ushort)(1 << ((byte)local_d0 - 1 & 0x1f));
          local_100 = uVar6 - 10;
          puVar7 = (ushort *)(local_18 + (long)((int)uVar2 >> ((byte)local_d0 & 0x1f)) * 2);
          sVar4 = (short)iVar1;
          if (*puVar7 == 0) {
            *puVar7 = sVar4 + (short)*(undefined4 *)(local_10 + 100);
            iVar3 = *(int *)(local_10 + 100);
            *(int *)(local_10 + 100) = iVar3 + 1;
            local_108 = (ushort *)(*(long *)(local_10 + 0x78) + (long)iVar3 * 4);
            if (*(int *)(local_10 + 0x68) < *(int *)(local_10 + 100)) {
              return L'\0';
            }
            *local_108 = 0;
            local_108[1] = 0;
          }
          else {
            if (((int)(uint)*puVar7 < iVar1) ||
               (iVar1 + *(int *)(local_10 + 100) <= (int)(uint)*puVar7)) {
              return L'\0';
            }
            local_108 = (ushort *)
                        (*(long *)(local_10 + 0x78) + (long)(int)((uint)*puVar7 - iVar1) * 4);
          }
          while (local_100 = local_100 + -1, 0 < local_100) {
            if ((uVar2 & local_fa) == 0) {
              if ((int)(uint)local_108[1] < iVar1) {
                local_108[1] = sVar4 + (short)*(undefined4 *)(local_10 + 100);
                iVar3 = *(int *)(local_10 + 100);
                *(int *)(local_10 + 100) = iVar3 + 1;
                local_108 = (ushort *)(*(long *)(local_10 + 0x78) + (long)iVar3 * 4);
                if (*(int *)(local_10 + 0x68) < *(int *)(local_10 + 100)) {
                  return L'\0';
                }
                *local_108 = 0;
                local_108[1] = 0;
              }
              else {
                local_108 = (ushort *)
                            (*(long *)(local_10 + 0x78) +
                            (long)(int)((uint)local_108[1] - iVar1) * 4);
              }
            }
            else if ((int)(uint)*local_108 < iVar1) {
              *local_108 = sVar4 + (short)*(undefined4 *)(local_10 + 100);
              iVar3 = *(int *)(local_10 + 100);
              *(int *)(local_10 + 100) = iVar3 + 1;
              local_108 = (ushort *)(*(long *)(local_10 + 0x78) + (long)iVar3 * 4);
              if (*(int *)(local_10 + 0x68) < *(int *)(local_10 + 100)) {
                return L'\0';
              }
              *local_108 = 0;
              local_108[1] = 0;
            }
            else {
              local_108 = (ushort *)
                          (*(long *)(local_10 + 0x78) + (long)(int)((uint)*local_108 - iVar1) * 4);
            }
            local_fa = (ushort)((int)(uint)local_fa >> 1);
          }
          if ((uVar2 & local_fa) == 0) {
            if (local_108[1] != 0) {
              return L'\0';
            }
            local_108[1] = uVar5;
          }
          else {
            if (*local_108 != 0) {
              return L'\0';
            }
            *local_108 = uVar5;
          }
        }
      }
    }
    local_4 = L'\x01';
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		int htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			while (--cnt >= 0)
				p[cnt] = (uint16_t)i;
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}